

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTaskManager.hpp
# Opt level: O0

void __thiscall sftm::CTaskManager::CTaskManager(CTaskManager *this)

{
  CTaskManager *this_local;
  
  std::array<sftm::CWorker,_64UL>::array(&this->m_workers);
  this->m_nWorkerCount = 0;
  std::condition_variable::condition_variable(&this->m_cvWorkerIdle);
  std::mutex::mutex(&this->m_mtxWorkerIdle);
  return;
}

Assistant:

CTaskManager() noexcept {}